

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bcatblk(bstring b,uchar *s,int len)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  uint uVar7;
  tagbstring t;
  tagbstring local_20;
  
  iVar4 = -1;
  iVar5 = -1;
  if ((b != (bstring)0x0) && (puVar6 = b->data, iVar5 = iVar4, puVar6 != (uchar *)0x0)) {
    uVar2 = b->slen;
    if (((-1 < (long)(int)uVar2) &&
        (((uVar3 = b->mlen, (int)uVar2 <= (int)uVar3 && (-1 < len)) && (s != (uchar *)0x0)))) &&
       (uVar3 != 0)) {
      lVar1 = (ulong)(uint)len + (ulong)uVar2;
      uVar7 = (uint)lVar1;
      if (uVar7 < uVar3) {
        if (len != 0) {
          memmove(puVar6 + (int)uVar2,s,(ulong)(uint)len);
          puVar6 = b->data;
        }
        b->slen = uVar7;
        puVar6[lVar1] = '\0';
        iVar5 = 0;
      }
      else {
        local_20.mlen = -1;
        local_20.slen = len;
        local_20.data = s;
        iVar5 = bconcat(b,&local_20);
      }
    }
  }
  return iVar5;
}

Assistant:

int bcatblk (bstring b, const unsigned char * s, int len) {
struct tagbstring t;
int nl;

	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen < b->slen
	 || b->mlen <= 0 || s == NULL || len < 0) return BSTR_ERR;

	if ((nl = b->slen + len) < 0) return BSTR_ERR; /* Overflow? */
	if (nl < b->mlen) {
		bBlockCopy (&b->data[b->slen], s, len);
		b->slen = nl;
		b->data[nl] = '\0';
		return BSTR_OK;
	}
	blk2tbstr (t, s, len);
	return bconcat (b, &t);
}